

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTimeValidator.cpp
# Opt level: O0

XProtoType * __thiscall xercesc_4_0::DateTimeValidator::getProtoType(DateTimeValidator *this)

{
  DateTimeValidator *this_local;
  
  return (XProtoType *)classDateTimeValidator;
}

Assistant:

void DateTimeValidator::serialize(XSerializeEngine& serEng)
{
    /***
     *
     * Note: All its derivatives share the same number type, that is
     *       XMLNumber::DateTime, so this class would write it.
     ***/

    if (serEng.isStoring())
    {
        serEng<<(int) XMLNumber::DateTime;
    }

    AbstractNumericFacetValidator::serialize(serEng);

    //dateTime can be instantiated during checkContent(), so don't serialize it.
}